

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManNodeIfToGia_rec
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj,Vec_Ptr_t *vVisited,int fHash)

{
  If_Cut_t *pIVar1;
  If_Obj_t **ppIVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  void **ppvVar6;
  int iVar7;
  If_Obj_t *pIVar8;
  
  fVar5 = (pIfObj->CutBest).Area;
  if (fVar5 != 0.0) {
    return (int)fVar5;
  }
  pIVar1 = &pIfObj->CutBest;
  uVar3 = vVisited->nCap;
  if (vVisited->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,0x80);
      }
      vVisited->pArray = ppvVar6;
      iVar7 = 0x10;
    }
    else {
      iVar7 = uVar3 * 2;
      if (iVar7 <= (int)uVar3) goto LAB_0020fcca;
      if (vVisited->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vVisited->pArray,(ulong)uVar3 << 4);
      }
      vVisited->pArray = ppvVar6;
    }
    vVisited->nCap = iVar7;
  }
LAB_0020fcca:
  iVar7 = vVisited->nSize;
  vVisited->nSize = iVar7 + 1;
  vVisited->pArray[iVar7] = pIVar1;
  (pIfObj->CutBest).Area = -NAN;
  fVar5 = -NAN;
  pIVar8 = pIfObj;
  if (((undefined1  [112])*pIfObj & (undefined1  [112])0xf) != (undefined1  [112])0x2) {
    do {
      uVar3 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIVar8->pFanin0,vVisited,fHash);
      if ((uVar3 != 0xffffffff) &&
         (uVar4 = Gia_ManNodeIfToGia_rec(pNew,pIfMan,pIVar8->pFanin1,vVisited,fHash),
         uVar4 != 0xffffffff)) {
        if (fHash == 0) {
          if (((int)uVar3 < 0) || ((int)uVar4 < 0)) goto LAB_0020fdca;
          fVar5 = (float)Gia_ManAppendAnd(pNew,*(uint *)pIVar8 >> 4 & 1 ^ uVar3,
                                          *(uint *)pIVar8 >> 5 & 1 ^ uVar4);
        }
        else {
          if (((int)uVar3 < 0) || ((int)uVar4 < 0)) {
LAB_0020fdca:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          fVar5 = (float)Gia_ManHashAnd(pNew,*(uint *)pIVar8 >> 4 & 1 ^ uVar3,
                                        *(uint *)pIVar8 >> 5 & 1 ^ uVar4);
        }
        if (((*(uint *)pIfObj ^ *(uint *)pIVar8) & 0x40) != 0) {
          if ((int)fVar5 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          fVar5 = (float)((uint)fVar5 ^ 1);
        }
        pIVar1->Area = fVar5;
        break;
      }
      ppIVar2 = &pIVar8->pEquiv;
      pIVar8 = *ppIVar2;
    } while (*ppIVar2 != (If_Obj_t *)0x0);
    fVar5 = pIVar1->Area;
  }
  return (int)fVar5;
}

Assistant:

int Gia_ManNodeIfToGia_rec( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj, Vec_Ptr_t * vVisited, int fHash )
{
    If_Cut_t * pCut;
    If_Obj_t * pTemp;
    int iFunc, iFunc0, iFunc1;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    // if the cut is visited, return the result
    if ( If_CutDataInt(pCut) )
        return If_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    If_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( If_ObjIsCi(pIfObj) )
        return If_CutDataInt(pCut);
    // compute the functions of the children
    for ( pTemp = pIfObj; pTemp; pTemp = pTemp->pEquiv )
    {
        iFunc0 = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pTemp->pFanin0, vVisited, fHash );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = Gia_ManNodeIfToGia_rec( pNew, pIfMan, pTemp->pFanin1, vVisited, fHash );
        if ( iFunc1 == ~0 )
            continue;
        // both branches are solved
        if ( fHash )
            iFunc = Gia_ManHashAnd( pNew, Abc_LitNotCond(iFunc0, pTemp->fCompl0), Abc_LitNotCond(iFunc1, pTemp->fCompl1) ); 
        else
            iFunc = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iFunc0, pTemp->fCompl0), Abc_LitNotCond(iFunc1, pTemp->fCompl1) ); 
        if ( pTemp->fPhase != pIfObj->fPhase )
            iFunc = Abc_LitNot(iFunc);
        If_CutSetDataInt( pCut, iFunc );
        break;
    }
    return If_CutDataInt(pCut);
}